

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall mkvmuxer::SeekHead::MaxEntrySize(SeekHead *this)

{
  uint64 type;
  uint64 uVar1;
  uint64 uVar2;
  uint64_t max_entry_size;
  uint64_t max_entry_payload_size;
  uint64 in_stack_ffffffffffffffd8;
  uint64 in_stack_ffffffffffffffe0;
  
  type = EbmlElementSize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  uVar1 = EbmlElementSize(type,in_stack_ffffffffffffffd8);
  uVar2 = EbmlMasterElementSize(type,in_stack_ffffffffffffffd8);
  return uVar2 + type + uVar1;
}

Assistant:

uint64_t SeekHead::MaxEntrySize() const {
  const uint64_t max_entry_payload_size =
      EbmlElementSize(libwebm::kMkvSeekID,
                      static_cast<uint64>(UINT64_C(0xffffffff))) +
      EbmlElementSize(libwebm::kMkvSeekPosition,
                      static_cast<uint64>(UINT64_C(0xffffffffffffffff)));
  const uint64_t max_entry_size =
      EbmlMasterElementSize(libwebm::kMkvSeek, max_entry_payload_size) +
      max_entry_payload_size;

  return max_entry_size;
}